

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_object_isSealed(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int is_frozen)

{
  int64_t iVar1;
  JSValue obj;
  JSPropertyEnum *tab;
  int iVar2;
  uint uVar3;
  uint uVar4;
  JSValueUnion JVar5;
  int64_t iVar6;
  int64_t extraout_RDX;
  int64_t extraout_RDX_00;
  ulong uVar7;
  JSValue JVar8;
  uint32_t len;
  JSPropertyEnum *props;
  JSPropertyDescriptor desc;
  uint local_84;
  JSPropertyEnum *local_80;
  JSValueUnion local_78;
  int64_t local_70;
  JSPropertyDescriptor local_68;
  
  JVar5 = (JSValueUnion)(argv->u).ptr;
  iVar1 = argv->tag;
  iVar6 = 1;
  if ((int)iVar1 == -1) {
    local_78 = JVar5;
    iVar2 = JS_GetOwnPropertyNamesInternal(ctx,&local_80,&local_84,(JSObject *)JVar5.ptr,3);
    tab = local_80;
    if (iVar2 == 0) {
      local_70 = iVar1;
      if ((ulong)local_84 != 0) {
        uVar7 = 0;
        do {
          uVar3 = JS_GetOwnPropertyInternal(ctx,&local_68,(JSObject *)JVar5.ptr,tab[uVar7].atom);
          iVar6 = extraout_RDX;
          if ((int)uVar3 < 0) {
            iVar2 = 5;
            uVar4 = uVar3;
          }
          else {
            if (uVar3 != 0) {
              js_free_desc(ctx,&local_68);
              iVar2 = 6;
              iVar6 = extraout_RDX_00;
              uVar4 = 0;
              if (((local_68.flags & 1U) != 0) ||
                 (iVar6 = CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),is_frozen != 0),
                 (is_frozen != 0 & (byte)((local_68.flags & 2U) >> 1)) != 0)) goto LAB_00162e39;
            }
            iVar2 = 0;
            uVar4 = uVar3;
          }
LAB_00162e39:
          if (iVar2 != 0) {
            if (iVar2 == 5) {
              js_free_prop_enum(ctx,tab,local_84);
              goto LAB_00162da5;
            }
            if (iVar2 == 6) goto LAB_00162e74;
            JVar5.float64 = 0.0;
            goto LAB_00162db3;
          }
          uVar7 = uVar7 + 1;
        } while (local_84 != uVar7);
      }
      obj.tag = local_70;
      obj.u.ptr = local_78.ptr;
      uVar4 = JS_IsExtensible(ctx,obj);
      if (-1 < (int)uVar4) {
        uVar4 = uVar4 ^ 1;
LAB_00162e74:
        js_free_prop_enum(ctx,local_80,local_84);
        JVar5._1_7_ = 0;
        JVar5.int32._0_1_ = uVar4 != 0;
        iVar6 = 1;
        goto LAB_00162db3;
      }
    }
LAB_00162da5:
    JVar5.float64 = 0.0;
    iVar6 = 6;
  }
  else {
    JVar5.float64 = 4.94065645841247e-324;
  }
LAB_00162db3:
  JVar8.tag = iVar6;
  JVar8.u.float64 = JVar5.float64;
  return JVar8;
}

Assistant:

static JSValue js_object_isSealed(JSContext *ctx, JSValueConst this_val,
                                  int argc, JSValueConst *argv, int is_frozen)
{
    JSValueConst obj = argv[0];
    JSObject *p;
    JSPropertyEnum *props;
    uint32_t len, i;
    int flags, res;
    
    if (!JS_IsObject(obj))
        return JS_TRUE;

    p = JS_VALUE_GET_OBJ(obj);
    flags = JS_GPN_STRING_MASK | JS_GPN_SYMBOL_MASK;
    if (JS_GetOwnPropertyNamesInternal(ctx, &props, &len, p, flags))
        return JS_EXCEPTION;

    for(i = 0; i < len; i++) {
        JSPropertyDescriptor desc;
        JSAtom prop = props[i].atom;

        res = JS_GetOwnPropertyInternal(ctx, &desc, p, prop);
        if (res < 0)
            goto exception;
        if (res) {
            js_free_desc(ctx, &desc);
            if ((desc.flags & JS_PROP_CONFIGURABLE)
            ||  (is_frozen && (desc.flags & JS_PROP_WRITABLE))) {
                res = FALSE;
                goto done;
            }
        }
    }
    res = JS_IsExtensible(ctx, obj);
    if (res < 0)
        return JS_EXCEPTION;
    res ^= 1;
done:        
    js_free_prop_enum(ctx, props, len);
    return JS_NewBool(ctx, res);

exception:
    js_free_prop_enum(ctx, props, len);
    return JS_EXCEPTION;
}